

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::CidrRange> * __thiscall
kj::ArrayBuilder<kj::CidrRange>::operator=
          (ArrayBuilder<kj::CidrRange> *this,ArrayBuilder<kj::CidrRange> *other)

{
  ArrayBuilder<kj::CidrRange> *other_local;
  ArrayBuilder<kj::CidrRange> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (CidrRange *)0x0;
  other->pos = (RemoveConst<kj::CidrRange> *)0x0;
  other->endPtr = (CidrRange *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }